

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O3

ostream * indigox::operator<<(ostream *s,Element_p *e)

{
  ostream *poVar1;
  String local_30;
  
  Element::ToString_abi_cxx11_
            (&local_30,(e->super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (s,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& s, ix::Element_p e) {
    return (s << e->ToString());
  }